

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O2

BVec4 __thiscall deqp::gles3::Functional::getChannelMask(Functional *this,ChannelOrder order)

{
  switch(order) {
  case RG:
    *(undefined4 *)this = 0x101;
    break;
  case RGB:
  case sRGB:
    *(undefined4 *)this = 0x10101;
    break;
  case RGBA:
  case sRGBA:
    *(undefined4 *)this = 0x1010101;
    break;
  default:
    if (order == R) {
      *(undefined4 *)this = 1;
      break;
    }
  case RA:
  case ARGB:
  case BGR:
  case BGRA:
  case sR:
  case sRG:
    tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)this,false);
  }
  return (BVec4)SUB84(this,0);
}

Assistant:

static tcu::BVec4 getChannelMask (tcu::TextureFormat::ChannelOrder order)
{
	switch (order)
	{
		case tcu::TextureFormat::R:		return tcu::BVec4(true,	false,	false,	false);
		case tcu::TextureFormat::RG:	return tcu::BVec4(true,	true,	false,	false);
		case tcu::TextureFormat::RGB:	return tcu::BVec4(true,	true,	true,	false);
		case tcu::TextureFormat::RGBA:	return tcu::BVec4(true,	true,	true,	true);
		case tcu::TextureFormat::sRGB:	return tcu::BVec4(true,	true,	true,	false);
		case tcu::TextureFormat::sRGBA:	return tcu::BVec4(true,	true,	true,	true);
		default:
			DE_ASSERT(false);
			return tcu::BVec4(false);
	}
}